

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O1

Expression * __thiscall CFG::Block::Render(Block *this,RelooperBuilder *Builder,bool InLoop)

{
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  int *piVar1;
  ulong *puVar2;
  _Rb_tree_header *p_Var3;
  uint uVar4;
  _func_int **pp_Var5;
  _List_node_base *p_Var6;
  IString *this_01;
  size_type sVar7;
  _Hash_node_base *p_Var8;
  uint uVar9;
  undefined8 uVar10;
  uint uVar11;
  int iVar12;
  Name *Value;
  uint uVar13;
  LocalSet *item;
  undefined1 auVar14 [8];
  Shape *pSVar15;
  Block *this_02;
  Binary *this_03;
  Binary *this_04;
  long *plVar16;
  Block *pBVar17;
  undefined8 *puVar18;
  size_type sVar19;
  Block *any;
  Expression *pEVar20;
  Block *pBVar21;
  Break *this_05;
  Switch *item_00;
  _List_node_base *p_Var22;
  Shape *pSVar23;
  ulong uVar24;
  Shape *pSVar25;
  _Hash_node_base *p_Var26;
  __node_base _Var27;
  pointer pcVar28;
  undefined1 auVar29 [8];
  uint uVar30;
  RelooperBuilder *pRVar31;
  _Self __tmp;
  _List_node_base *p_Var32;
  undefined1 uVar33;
  MixedArena *pMVar34;
  Branch *this_06;
  size_type *this_07;
  bool bVar35;
  bool bVar36;
  string_view s;
  string_view s_00;
  pair<std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>,_bool> pVar37;
  string_view sVar38;
  string_view sVar39;
  pointer *local_170;
  long local_168;
  pointer local_160 [2];
  Block *local_150;
  Shape *local_148;
  size_type *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  undefined1 auStack_118 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> Table;
  char *pcStack_f8;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> Base;
  Shape *local_c8;
  Binary *local_c0;
  undefined1 auStack_b8 [8];
  map<CFG::Block_*,_wasm::Name,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
  BlockNameMap;
  long local_80;
  __node_base local_78;
  undefined8 uStack_70;
  Shape *local_68;
  Shape *local_60;
  RelooperBuilder *local_58;
  Binary *local_50;
  Block *local_48;
  Block *local_40;
  bool local_31;
  
  pMVar34 = &((Builder->super_Builder).wasm)->allocator;
  __str_2.field_2._8_8_ = MixedArena::allocSpace(pMVar34,0x40,8);
  *(undefined4 *)__str_2.field_2._8_8_ = 1;
  *(undefined8 *)(__str_2.field_2._8_8_ + 8) = 0;
  *(undefined8 *)(__str_2.field_2._8_8_ + 0x10) = 0;
  *(undefined8 *)(__str_2.field_2._8_8_ + 0x18) = 0;
  *(undefined8 *)(__str_2.field_2._8_8_ + 0x20) = 0;
  *(undefined8 *)(__str_2.field_2._8_8_ + 0x28) = 0;
  *(undefined8 *)(__str_2.field_2._8_8_ + 0x30) = 0;
  *(MixedArena **)(__str_2.field_2._8_8_ + 0x38) = pMVar34;
  if ((this->IsCheckedMultipleEntry & InLoop) == 1) {
    this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
              (__str_2.field_2._8_8_ + 0x20);
    item = RelooperBuilder::makeSetLabel(Builder,0);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (this_00,(Expression *)item);
  }
  if (this->Code != (Expression *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
               (__str_2.field_2._8_8_ + 0x20),this->Code);
  }
  pp_Var5 = (_func_int **)(this->ProcessedBranchesOut).Map._M_h._M_element_count;
  if (pp_Var5 == (_func_int **)0x0) goto LAB_00ac2c27;
  pSVar25 = this->Parent->Next;
  local_68 = (Shape *)0x0;
  if ((pSVar25 != (Shape *)0x0) && (pSVar25->Type == Multiple)) {
    local_68 = pSVar25;
  }
  if (local_68 == (Shape *)0x0) {
    local_31 = true;
  }
  else {
    this->Parent->Next = pSVar25->Next;
    local_31 = pp_Var5 != local_68[2]._vptr_Shape || this->SwitchCondition != (Expression *)0x0;
  }
  Base.field_2._8_8_ = &(this->ProcessedBranchesOut).List;
  p_Var32 = (this->ProcessedBranchesOut).List.
            super__List_base<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var32 == (_List_node_base *)Base.field_2._8_8_) {
    pBVar21 = (Block *)0x0;
  }
  else {
    pBVar21 = (Block *)0x0;
    p_Var22 = p_Var32;
    do {
      if (this->SwitchCondition == (Expression *)0x0) {
        p_Var6 = p_Var22[1]._M_prev[1]._M_next;
      }
      else {
        p_Var6 = p_Var22[1]._M_prev[1]._M_prev;
      }
      if (p_Var6 == (_List_node_base *)0x0) {
        if (pBVar21 != (Block *)0x0) {
          __assert_fail("!DefaultTarget && \"block has branches without a default (nullptr for the \" \"condition)\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                        ,0xe4,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
        }
        pBVar21 = (Block *)p_Var22[1]._M_next;
      }
      p_Var22 = p_Var22->_M_next;
    } while (p_Var22 != (_List_node_base *)Base.field_2._8_8_);
  }
  if (pBVar21 == (Block *)0x0) {
    __assert_fail("DefaultTarget",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                  ,0xe9,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
  }
  local_58 = Builder;
  if (this->SwitchCondition == (Expression *)0x0) {
    local_150 = (Block *)&this->ProcessedBranchesOut;
    auStack_b8 = (undefined1  [8])0x0;
    BlockNameMap._M_t._M_impl._0_8_ = 0;
    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    pSVar25 = local_68 + 1;
    local_60 = (Shape *)&local_68[1].Id;
    local_148 = (Shape *)CONCAT44(local_148._4_4_,(uint)InLoop);
    local_50 = (Binary *)0x0;
    local_40 = (Block *)0x0;
    auVar14 = (undefined1  [8])0x0;
    do {
      if (p_Var32 == (_List_node_base *)Base.field_2._8_8_) {
        Base._M_dataplus._M_p = (pointer)0x0;
        local_f0 = (undefined1  [8])pBVar21;
        pVar37 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::insert
                           ((InsertOrderedMap<CFG::Block_*,_CFG::Branch_*> *)local_150,
                            (pair<CFG::Block_*const,_CFG::Branch_*> *)local_f0);
        this_06 = (Branch *)pVar37.first._M_node._M_node[1]._M_prev;
        pBVar17 = pBVar21;
LAB_00ac1f65:
        if (local_31 == false) {
          bVar36 = false;
        }
        else {
          bVar36 = pBVar17->IsCheckedMultipleEntry;
        }
        local_48 = (Block *)auVar14;
        if (local_68 == (Shape *)0x0) {
          bVar35 = false;
        }
        else {
          sVar19 = std::
                   map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                   ::count((map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                            *)pSVar25,&pBVar17->Id);
          bVar35 = sVar19 != 0;
        }
        if (bVar35) {
          if (this_06->Type != Break) {
            __assert_fail("Details->Type == Branch::Break",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                          ,0x10a,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
          }
          this_06->Type = Direct;
        }
        if (((bVar36 != false) || (this_06->Type != Direct || bVar35)) ||
           (this_06->Code != (Expression *)0x0)) {
          auVar14 = (undefined1  [8])Branch::Render(this_06,local_58,pBVar17,bVar36);
          pRVar31 = local_58;
          if (bVar35) {
            pSVar23 = local_68[1].Next;
            pSVar15 = local_60;
            if (pSVar23 != (Shape *)0x0) {
              do {
                if (pBVar17->Id <= (int)pSVar23->Type) {
                  pSVar15 = pSVar23;
                }
                pSVar23 = (&pSVar23->Next)[(int)pSVar23->Type < pBVar17->Id];
              } while (pSVar23 != (Shape *)0x0);
            }
            pSVar23 = local_60;
            if ((pSVar15 != local_60) && (pSVar23 = pSVar15, pBVar17->Id < (int)pSVar15->Type)) {
              pSVar23 = local_60;
            }
            pEVar20 = (Expression *)
                      (**(code **)(*pSVar23[1]._vptr_Shape + 0x10))
                                (pSVar23[1]._vptr_Shape,local_58,(ulong)local_148 & 0xffffffff);
            auVar14 = (undefined1  [8])
                      ::wasm::Builder::blockify
                                (&pRVar31->super_Builder,(Expression *)auVar14,pEVar20);
          }
        }
        else {
          auVar14 = (undefined1  [8])0x0;
          pRVar31 = local_58;
        }
        if (auVar14 == (undefined1  [8])0x0) {
          pEVar20 = this_06->Condition;
          this_03 = (Binary *)
                    MixedArena::allocSpace(&((pRVar31->super_Builder).wasm)->allocator,0x20,8);
          (((SpecificExpression<(wasm::Expression::Id)15> *)
           &this_03->super_SpecificExpression<(wasm::Expression::Id)16>)->super_Expression)._id =
               UnaryId;
          (((SpecificExpression<(wasm::Expression::Id)15> *)
           &this_03->super_SpecificExpression<(wasm::Expression::Id)16>)->super_Expression).type.id
               = 0;
          this_03->op = EqZInt32;
          this_03->left = pEVar20;
          ::wasm::Unary::finalize((Unary *)this_03);
          auVar14 = (undefined1  [8])local_48;
          if (local_50 != (Binary *)0x0) {
            this_04 = (Binary *)
                      MixedArena::allocSpace(&((pRVar31->super_Builder).wasm)->allocator,0x28,8);
            (this_04->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
                 BinaryId;
            (this_04->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id =
                 0;
            this_04->op = AndInt32;
            this_04->left = (Expression *)local_50;
            this_04->right = (Expression *)this_03;
            ::wasm::Binary::finalize(this_04);
            auVar14 = (undefined1  [8])local_48;
            this_03 = this_04;
          }
        }
        else if (p_Var32 == (_List_node_base *)Base.field_2._8_8_) {
          if (local_50 != (Binary *)0x0) {
            pBVar17 = (Block *)MixedArena::allocSpace
                                         (&((pRVar31->super_Builder).wasm)->allocator,0x28,8);
            (((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar17->relooper)->super_Expression).
            _id = IfId;
            (pBVar17->BranchesOut).Map._M_h._M_buckets = (__buckets_ptr)0x0;
            (pBVar17->BranchesOut).Map._M_h._M_element_count = 0;
            (pBVar17->BranchesOut).Map._M_h._M_bucket_count = (size_type)local_50;
            (pBVar17->BranchesOut).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)auVar14;
            ::wasm::If::finalize((If *)pBVar17);
            if ((((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar17->relooper)->
                super_Expression)._id != IfId) {
              __assert_fail("int(_id) == int(T::SpecificId)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                            ,0x314,"T *wasm::Expression::cast() [T = wasm::If]");
            }
            local_f0 = (undefined1  [8])pBVar17;
            std::vector<wasm::If*,std::allocator<wasm::If*>>::emplace_back<wasm::If*>
                      ((vector<wasm::If*,std::allocator<wasm::If*>> *)auStack_b8,(If **)local_f0);
            auVar14 = (undefined1  [8])pBVar17;
          }
          pBVar17 = local_48;
          if (local_40 == (Block *)0x0) {
            this_03 = local_50;
            if (local_48 != (Block *)0x0) {
              __assert_fail("!Root",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                            ,0x123,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
            }
          }
          else {
            (local_40->BranchesOut).Map._M_h._M_element_count = (size_type)auVar14;
            ::wasm::If::finalize((If *)local_40);
            auVar14 = (undefined1  [8])pBVar17;
            this_03 = local_50;
          }
        }
        else {
          pEVar20 = this_06->Condition;
          this_02 = (Block *)MixedArena::allocSpace
                                       (&((pRVar31->super_Builder).wasm)->allocator,0x28,8);
          pBVar17 = local_40;
          (((SpecificExpression<(wasm::Expression::Id)1> *)&this_02->relooper)->super_Expression).
          _id = IfId;
          (this_02->BranchesOut).Map._M_h._M_buckets = (__buckets_ptr)0x0;
          (this_02->BranchesOut).Map._M_h._M_element_count = 0;
          (this_02->BranchesOut).Map._M_h._M_bucket_count = (size_type)pEVar20;
          (this_02->BranchesOut).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)auVar14;
          ::wasm::If::finalize((If *)this_02);
          local_f0 = (undefined1  [8])this_02;
          if (BlockNameMap._M_t._M_impl._0_8_ ==
              BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_) {
            std::vector<wasm::If*,std::allocator<wasm::If*>>::_M_realloc_insert<wasm::If*const&>
                      ((vector<wasm::If*,std::allocator<wasm::If*>> *)auStack_b8,
                       (iterator)BlockNameMap._M_t._M_impl._0_8_,(If **)local_f0);
          }
          else {
            *(Block **)BlockNameMap._M_t._M_impl._0_8_ = this_02;
            BlockNameMap._M_t._M_impl._0_8_ = BlockNameMap._M_t._M_impl._0_8_ + 8;
          }
          if (pBVar17 == (Block *)0x0) {
            if (local_48 != (Block *)0x0) {
              __assert_fail("!Root",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                            ,0x12d,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
            }
            local_40 = (Block *)local_f0;
            auVar14 = local_f0;
            this_03 = local_50;
          }
          else {
            (pBVar17->BranchesOut).Map._M_h._M_element_count = (size_type)local_f0;
            ::wasm::If::finalize((If *)pBVar17);
            local_40 = (Block *)local_f0;
            auVar14 = (undefined1  [8])local_48;
            this_03 = local_50;
          }
        }
        local_50 = this_03;
        iVar12 = (uint)(p_Var32 == (_List_node_base *)Base.field_2._8_8_) << 2;
      }
      else {
        if ((Block *)p_Var32[1]._M_next != pBVar21) {
          this_06 = (Branch *)p_Var32[1]._M_prev;
          pBVar17 = (Block *)p_Var32[1]._M_next;
          if (this_06->Condition == (Expression *)0x0) {
            __assert_fail("Details->Condition",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                          ,0x102,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
          }
          goto LAB_00ac1f65;
        }
        iVar12 = 6;
      }
      if ((iVar12 != 0) && (iVar12 != 6)) goto LAB_00ac22e4;
      p_Var32 = p_Var32->_M_next;
    } while( true );
  }
  p_Var3 = &BlockNameMap._M_t._M_impl.super__Rb_tree_header;
  auStack_b8 = (undefined1  [8])p_Var3;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_b8,"switch$","");
  uVar4 = this->Id;
  uVar9 = -uVar4;
  if (0 < (int)uVar4) {
    uVar9 = uVar4;
  }
  uVar30 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar11 = 4;
    do {
      uVar30 = uVar11;
      uVar13 = (uint)uVar24;
      if (uVar13 < 100) {
        uVar30 = uVar30 - 2;
        goto LAB_00ac2318;
      }
      if (uVar13 < 1000) {
        uVar30 = uVar30 - 1;
        goto LAB_00ac2318;
      }
      if (uVar13 < 10000) goto LAB_00ac2318;
      uVar24 = uVar24 / 10000;
      uVar11 = uVar30 + 4;
    } while (99999 < uVar13);
    uVar30 = uVar30 + 1;
  }
LAB_00ac2318:
  BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_78;
  local_150 = this;
  std::__cxx11::string::_M_construct
            ((ulong)&BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (char)uVar30 - (char)((int)uVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((uVar4 >> 0x1f) +
                     BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count),uVar30,uVar9);
  pRVar31 = local_58;
  p_Var26 = (_Hash_node_base *)0xf;
  if (auStack_b8 != (undefined1  [8])p_Var3) {
    p_Var26 = (_Hash_node_base *)BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  }
  if (p_Var26 < (_Hash_node_base *)(local_80 + BlockNameMap._M_t._M_impl._0_8_)) {
    _Var27._M_nxt = (_Hash_node_base *)0xf;
    if ((__node_base *)BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_78) {
      _Var27._M_nxt = local_78._M_nxt;
    }
    if (_Var27._M_nxt < (_Hash_node_base *)(local_80 + BlockNameMap._M_t._M_impl._0_8_))
    goto LAB_00ac2390;
    plVar16 = (long *)std::__cxx11::string::replace
                                ((ulong)&BlockNameMap._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count,0,(char *)0x0,(ulong)auStack_b8);
  }
  else {
LAB_00ac2390:
    plVar16 = (long *)std::__cxx11::string::_M_append
                                (auStack_b8,
                                 BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  local_f0 = (undefined1  [8])&Base._M_string_length;
  pBVar21 = (Block *)(plVar16 + 2);
  if ((Block *)*plVar16 == pBVar21) {
    Base._M_string_length =
         *(size_type *)
          &((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar21->relooper)->super_Expression;
    Base.field_2._M_allocated_capacity = plVar16[3];
  }
  else {
    Base._M_string_length =
         *(size_type *)
          &((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar21->relooper)->super_Expression;
    local_f0 = (undefined1  [8])*plVar16;
  }
  Base._M_dataplus._M_p = (pointer)plVar16[1];
  *plVar16 = (long)pBVar21;
  plVar16[1] = 0;
  *(undefined1 *)
   &(((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar21->relooper)->super_Expression)._id =
       InvalidId;
  if ((__node_base *)BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_78) {
    operator_delete((void *)BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    (ulong)((long)&(local_78._M_nxt)->_M_nxt + 1));
  }
  uVar33 = SUB81(pBVar21,0);
  if (auStack_b8 != (undefined1  [8])p_Var3) {
    operator_delete((void *)auStack_b8,
                    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  auStack_b8 = (undefined1  [8])p_Var3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_b8,local_f0,Base._M_dataplus._M_p + (long)local_f0);
  std::__cxx11::string::append(auStack_b8);
  sVar38._M_str = (char *)0x0;
  sVar38._M_len = (size_t)auStack_b8;
  join_0x00000010_0x00000000_ =
       ::wasm::IString::interned((IString *)BlockNameMap._M_t._M_impl._0_8_,sVar38,(bool)uVar33);
  if (auStack_b8 != (undefined1  [8])p_Var3) {
    operator_delete((void *)auStack_b8,
                    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  auStack_b8 = (undefined1  [8])p_Var3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_b8,local_f0,Base._M_dataplus._M_p + (long)local_f0);
  std::__cxx11::string::append(auStack_b8);
  s._M_str = (char *)0x0;
  s._M_len = (size_t)auStack_b8;
  sVar38 = ::wasm::IString::interned((IString *)BlockNameMap._M_t._M_impl._0_8_,s,(bool)uVar33);
  if (auStack_b8 != (undefined1  [8])p_Var3) {
    operator_delete((void *)auStack_b8,
                    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&BlockNameMap;
  BlockNameMap._M_t._M_impl._0_8_ = (ulong)(uint)BlockNameMap._M_t._M_impl._4_4_ << 0x20;
  BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  pMVar34 = &((pRVar31->super_Builder).wasm)->allocator;
  BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  pBVar17 = (Block *)MixedArena::allocSpace(pMVar34,0x40,8);
  (((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar17->relooper)->super_Expression)._id =
       BlockId;
  (pBVar17->BranchesOut).Map._M_h._M_buckets = (__buckets_ptr)0x0;
  (pBVar17->BranchesOut).Map._M_h._M_bucket_count = 0;
  (pBVar17->BranchesOut).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pBVar17->BranchesOut).Map._M_h._M_element_count = 0;
  *(undefined8 *)&(pBVar17->BranchesOut).Map._M_h._M_rehash_policy = 0;
  (pBVar17->BranchesOut).Map._M_h._M_rehash_policy._M_next_resize = 0;
  (pBVar17->BranchesOut).Map._M_h._M_single_bucket = (__node_base_ptr)pMVar34;
  auStack_118 = (undefined1  [8])0x0;
  Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pBVar21 = *(Block **)Base.field_2._8_8_;
  local_c8 = (Shape *)sVar38._M_len;
  local_c0 = (Binary *)sVar38._M_str;
  local_48 = pBVar17;
  if (pBVar21 != (Block *)Base.field_2._8_8_) {
    local_148 = local_68 + 1;
    piVar1 = &local_68[1].Id;
    do {
      pSVar25 = local_68;
      local_40 = pBVar21;
      sVar39 = stack0xffffffffffffff00;
      if ((pBVar21->BranchesOut).Map._M_h._M_before_begin._M_nxt[3]._M_nxt != (_Hash_node_base *)0x0
         ) {
        local_140 = &__str_2._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,local_f0,Base._M_dataplus._M_p + (long)local_f0);
        std::__cxx11::string::append((char *)&local_140);
        uVar4 = *(uint *)((local_40->BranchesOut).Map._M_h._M_bucket_count + 0x150);
        uVar9 = -uVar4;
        if (0 < (int)uVar4) {
          uVar9 = uVar4;
        }
        uVar30 = 1;
        if (9 < uVar9) {
          uVar24 = (ulong)uVar9;
          uVar11 = 4;
          do {
            uVar30 = uVar11;
            uVar13 = (uint)uVar24;
            if (uVar13 < 100) {
              uVar30 = uVar30 - 2;
              goto LAB_00ac269f;
            }
            if (uVar13 < 1000) {
              uVar30 = uVar30 - 1;
              goto LAB_00ac269f;
            }
            if (uVar13 < 10000) goto LAB_00ac269f;
            uVar24 = uVar24 / 10000;
            uVar11 = uVar30 + 4;
          } while (99999 < uVar13);
          uVar30 = uVar30 + 1;
        }
LAB_00ac269f:
        local_170 = local_160;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_170,(char)uVar30 - (char)((int)uVar4 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar4 >> 0x1f) + (long)local_170),uVar30,uVar9);
        pRVar31 = local_58;
        pSVar25 = local_68;
        pcVar28 = (pointer)0xf;
        if (local_140 != &__str_2._M_string_length) {
          pcVar28 = (pointer)__str_2._M_string_length;
        }
        if (pcVar28 < __str_2._M_dataplus._M_p + local_168) {
          pcVar28 = (pointer)0xf;
          if (local_170 != local_160) {
            pcVar28 = local_160[0];
          }
          if (pcVar28 < __str_2._M_dataplus._M_p + local_168) goto LAB_00ac273a;
          puVar18 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,(ulong)local_140);
        }
        else {
LAB_00ac273a:
          puVar18 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_170);
        }
        BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_78;
        puVar2 = puVar18 + 2;
        if ((ulong *)*puVar18 == puVar2) {
          local_78._M_nxt = (_Hash_node_base *)*puVar2;
          uStack_70 = puVar18[3];
        }
        else {
          local_78._M_nxt = (_Hash_node_base *)*puVar2;
          BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*puVar18;
        }
        this_01 = (IString *)puVar18[1];
        *puVar18 = puVar2;
        puVar18[1] = 0;
        *(undefined1 *)puVar2 = 0;
        s_00._M_str = (char *)0x0;
        s_00._M_len = BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
        sVar39 = ::wasm::IString::interned(this_01,s_00,SUB81(puVar2,0));
        local_50 = (Binary *)sVar39._M_str;
        local_60 = (Shape *)sVar39._M_len;
        if ((__node_base *)BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count !=
            &local_78) {
          operator_delete((void *)BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (ulong)((long)&(local_78._M_nxt)->_M_nxt + 1));
          sVar39._M_str = (char *)local_50;
          sVar39._M_len = (size_t)local_60;
        }
        local_50 = (Binary *)sVar39._M_str;
        local_60 = (Shape *)sVar39._M_len;
        if (local_170 != local_160) {
          operator_delete(local_170,(ulong)(local_160[0] + 1));
          sVar39._M_str = (char *)local_50;
          sVar39._M_len = (size_t)local_60;
        }
        local_50 = (Binary *)sVar39._M_str;
        local_60 = (Shape *)sVar39._M_len;
        if (local_140 != &__str_2._M_string_length) {
          operator_delete(local_140,__str_2._M_string_length + 1);
          sVar39._M_str = (char *)local_50;
          sVar39._M_len = (size_t)local_60;
        }
      }
      local_50 = (Binary *)sVar39._M_str;
      local_60 = (Shape *)sVar39._M_len;
      if (local_31 == false) {
        uVar33 = false;
      }
      else {
        uVar33 = *(undefined1 *)((local_40->BranchesOut).Map._M_h._M_bucket_count + 0x168);
      }
      if (pSVar25 == (Shape *)0x0) {
        bVar36 = false;
      }
      else {
        sVar19 = std::
                 map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                 ::count((map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                          *)local_148,
                         (key_type_conflict1 *)
                         ((local_40->BranchesOut).Map._M_h._M_bucket_count + 0x150));
        sVar39._M_str = (char *)local_50;
        sVar39._M_len = (size_t)local_60;
        bVar36 = sVar19 != 0;
      }
      local_50 = (Binary *)sVar39._M_str;
      local_60 = (Shape *)sVar39._M_len;
      if (bVar36) {
        p_Var26 = (local_40->BranchesOut).Map._M_h._M_before_begin._M_nxt;
        if (*(int *)&p_Var26[1]._M_nxt != 1) {
          __assert_fail("Details->Type == Branch::Break",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                        ,0x15e,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
        }
        *(undefined4 *)&p_Var26[1]._M_nxt = 0;
      }
      if ((((bool)uVar33 != false) ||
          (p_Var26 = (local_40->BranchesOut).Map._M_h._M_before_begin._M_nxt,
          *(int *)&p_Var26[1]._M_nxt != 0 || bVar36)) ||
         (p_Var26[4]._M_nxt != (_Hash_node_base *)0x0)) {
        any = (Block *)Branch::Render((Branch *)
                                      (local_40->BranchesOut).Map._M_h._M_before_begin._M_nxt,
                                      pRVar31,(Block *)(local_40->BranchesOut).Map._M_h.
                                                       _M_bucket_count,(bool)uVar33);
        pRVar31 = local_58;
        sVar39._M_str = (char *)local_50;
        sVar39._M_len = (size_t)local_60;
        if (bVar36) {
          sVar7 = (local_40->BranchesOut).Map._M_h._M_bucket_count;
          pSVar25 = local_68[1].Next;
          pSVar23 = (Shape *)piVar1;
          if (pSVar25 != (Shape *)0x0) {
            iVar12 = *(int *)(sVar7 + 0x150);
            do {
              if (iVar12 <= (int)pSVar25->Type) {
                pSVar23 = pSVar25;
              }
              pSVar25 = (&pSVar25->Next)[(int)pSVar25->Type < iVar12];
            } while (pSVar25 != (Shape *)0x0);
          }
          pSVar25 = (Shape *)piVar1;
          if ((pSVar23 != (Shape *)piVar1) &&
             (pSVar25 = pSVar23, *(int *)(sVar7 + 0x150) < (int)pSVar23->Type)) {
            pSVar25 = (Shape *)piVar1;
          }
          pEVar20 = (Expression *)
                    (**(code **)(*pSVar25[1]._vptr_Shape + 0x10))
                              (pSVar25[1]._vptr_Shape,local_58,InLoop);
          any = ::wasm::Builder::blockify(&pRVar31->super_Builder,(Expression *)any,pEVar20);
          sVar39._M_str = (char *)local_50;
          sVar39._M_len = (size_t)local_60;
        }
      }
      else {
        any = (Block *)0x0;
      }
      local_50 = (Binary *)sVar39._M_str;
      local_60 = (Shape *)sVar39._M_len;
      if (any == (Block *)0x0) {
        pBVar21 = local_48;
        if ((local_40->BranchesOut).Map._M_h._M_before_begin._M_nxt[3]._M_nxt ==
            (_Hash_node_base *)0x0) {
          for (auVar14 = auStack_118;
              auVar14 !=
              (undefined1  [8])
              Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start; auVar14 = (undefined1  [8])((long)auVar14 + 0x10)) {
            if ((((pointer)auVar14)->super_IString).str._M_str == pcStack_f8) {
              (((pointer)auVar14)->super_IString).str._M_len = (size_t)local_c8;
              (((pointer)auVar14)->super_IString).str._M_str = (char *)local_c0;
            }
          }
          local_50 = local_c0;
          local_60 = local_c8;
          unique0x1000256d = sVar38;
        }
        else {
          local_50 = local_c0;
          local_60 = local_c8;
        }
      }
      else {
        pMVar34 = &((local_58->super_Builder).wasm)->allocator;
        pBVar21 = (Block *)MixedArena::allocSpace(pMVar34,0x40,8);
        (((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar21->relooper)->super_Expression)._id
             = BlockId;
        (pBVar21->BranchesOut).Map._M_h._M_buckets = (__buckets_ptr)0x0;
        (pBVar21->BranchesOut).Map._M_h._M_bucket_count = 0;
        (pBVar21->BranchesOut).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (pBVar21->BranchesOut).Map._M_h._M_element_count = 0;
        *(undefined8 *)&(pBVar21->BranchesOut).Map._M_h._M_rehash_policy = 0;
        (pBVar21->BranchesOut).Map._M_h._M_rehash_policy._M_next_resize = 0;
        (pBVar21->BranchesOut).Map._M_h._M_single_bucket = (__node_base_ptr)pMVar34;
        this_07 = &(pBVar21->BranchesOut).Map._M_h._M_element_count;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_07,
                   (Expression *)local_48);
        (local_48->BranchesOut).Map._M_h._M_bucket_count = (size_type)local_60;
        (local_48->BranchesOut).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_50;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_07,
                   (Expression *)any);
        if ((any->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id != 1)
        {
          this_05 = (Break *)MixedArena::allocSpace
                                       (&((local_58->super_Builder).wasm)->allocator,0x30,8);
          (this_05->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id =
               BreakId;
          (this_05->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
          (this_05->name).super_IString.str._M_len = 0;
          (this_05->name).super_IString.str._M_str = (char *)0x0;
          this_05->value = (Expression *)0x0;
          this_05->condition = (Expression *)0x0;
          (this_05->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
          (this_05->name).super_IString.str._M_len = (size_t)local_c8;
          (this_05->name).super_IString.str._M_str = (char *)local_c0;
          this_05->value = (Expression *)0x0;
          this_05->condition = (Expression *)0x0;
          ::wasm::Break::finalize(this_05);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_07
                     ,(Expression *)this_05);
        }
      }
      local_48 = pBVar21;
      p_Var26 = (local_40->BranchesOut).Map._M_h._M_before_begin._M_nxt[3]._M_nxt;
      if (p_Var26 != (_Hash_node_base *)0x0) {
        p_Var8 = p_Var26[1]._M_nxt;
        for (p_Var26 = p_Var26->_M_nxt; p_Var26 != p_Var8;
            p_Var26 = (_Hash_node_base *)((long)&p_Var26->_M_nxt + 4)) {
          uVar24 = (ulong)*(uint *)&p_Var26->_M_nxt;
          while ((ulong)((long)Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                               _M_impl.super__Vector_impl_data._M_start - (long)auStack_118 >> 4) <=
                 uVar24) {
            if (Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start ==
                Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<wasm::Name,std::allocator<wasm::Name>>::
              _M_realloc_insert<wasm::Name_const&>
                        ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_118,
                         (iterator)
                         Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (Name *)&Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              ((Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start)->super_IString).str._M_len =
                   (size_t)Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
              ((Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start)->super_IString).str._M_str = pcStack_f8;
              Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start =
                   Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
          }
          (((pointer)((long)auStack_118 + uVar24 * 0x10))->super_IString).str._M_len =
               (size_t)local_60;
          (((pointer)((long)auStack_118 + uVar24 * 0x10))->super_IString).str._M_str =
               (char *)local_50;
        }
      }
      pBVar21 = *(Block **)
                 &((SpecificExpression<(wasm::Expression::Id)1> *)&local_40->relooper)->
                  super_Expression;
      pRVar31 = local_58;
    } while (pBVar21 != (Block *)Base.field_2._8_8_);
  }
  auVar14 = (undefined1  [8])local_48;
  (local_48->BranchesOut).Map._M_h._M_bucket_count = (size_type)local_c8;
  (local_48->BranchesOut).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_c0;
  item_00 = ::wasm::Builder::makeSwitch<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                      (&pRVar31->super_Builder,
                       (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_118,
                       (Name)stack0xffffffffffffff00,local_150->SwitchCondition,(Expression *)0x0);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             &(pBVar17->BranchesOut).Map._M_h._M_element_count,(Expression *)item_00);
  if (auStack_118 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_118,
                    (long)Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_118);
  }
  std::
  _Rb_tree<CFG::Block_*,_std::pair<CFG::Block_*const,_wasm::Name>,_std::_Select1st<std::pair<CFG::Block_*const,_wasm::Name>_>,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<CFG::Block_*,_std::pair<CFG::Block_*const,_wasm::Name>,_std::_Select1st<std::pair<CFG::Block_*const,_wasm::Name>_>,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
               *)auStack_b8);
  if (local_f0 != (undefined1  [8])&Base._M_string_length) {
    uVar24 = Base._M_string_length + 1;
    auVar29 = local_f0;
LAB_00ac2c0a:
    operator_delete((void *)auVar29,uVar24);
  }
LAB_00ac2c0f:
  if (auVar14 != (undefined1  [8])0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
               (__str_2.field_2._8_8_ + 0x20),(Expression *)auVar14);
  }
LAB_00ac2c27:
  uVar10 = __str_2.field_2._8_8_;
  ::wasm::Block::finalize((Block *)__str_2.field_2._8_8_);
  return (Expression *)uVar10;
LAB_00ac22e4:
  while ((undefined1  [8])BlockNameMap._M_t._M_impl._0_8_ != auStack_b8) {
    puVar18 = (undefined8 *)(BlockNameMap._M_t._M_impl._0_8_ + -8);
    BlockNameMap._M_t._M_impl._0_8_ = BlockNameMap._M_t._M_impl._0_8_ + -8;
    ::wasm::If::finalize((If *)*puVar18);
  }
  if (auStack_b8 != (undefined1  [8])0x0) {
    uVar24 = BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ - (long)auStack_b8;
    auVar29 = auStack_b8;
    goto LAB_00ac2c0a;
  }
  goto LAB_00ac2c0f;
}

Assistant:

wasm::Expression* Block::Render(RelooperBuilder& Builder, bool InLoop) {
  auto* Ret = Builder.makeBlock();
  if (IsCheckedMultipleEntry && InLoop) {
    Ret->list.push_back(Builder.makeSetLabel(0));
  }
  if (Code) {
    Ret->list.push_back(Code);
  }

  if (!ProcessedBranchesOut.size()) {
    Ret->finalize();
    return Ret;
  }

  // in some cases it is clear we can avoid setting label, see later
  bool SetLabel = true;

  // A setting of the label variable (label = x) is necessary if it can
  // cause an impact. The main case is where we set label to x, then elsewhere
  // we check if label is equal to that value, i.e., that label is an entry
  // in a multiple block. We also need to reset the label when we enter
  // that block, so that each setting is a one-time action: consider
  //
  //    while (1) {
  //      if (check) label = 1;
  //      if (label == 1) { label = 0 }
  //    }
  //
  // (Note that this case is impossible due to fusing, but that is not
  // material here.) So setting to 0 is important just to clear the 1 for
  // future iterations.
  // TODO: When inside a loop, if necessary clear the label variable
  //       once on the top, and never do settings that are in effect clears

  // Fusing: If the next is a Multiple, we can fuse it with this block. Note
  // that we must be the Inner of a Simple, so fusing means joining a Simple
  // to a Multiple. What happens there is that all options in the Multiple
  // *must* appear in the Simple (the Simple is the only one reaching the
  // Multiple), so we can remove the Multiple and add its independent groups
  // into the Simple's branches.
  MultipleShape* Fused = Shape::IsMultiple(Parent->Next);
  if (Fused) {
    PrintDebug("Fusing Multiple to Simple\n", 0);
    Parent->Next = Parent->Next->Next;
    // When the Multiple has the same number of groups as we have branches,
    // they will all be fused, so it is safe to not set the label at all.
    // If a switch, then we can have multiple branches to the same target
    // (in different table indexes), and so this check is not sufficient
    // TODO: optimize
    if (SetLabel && Fused->InnerMap.size() == ProcessedBranchesOut.size() &&
        !SwitchCondition) {
      SetLabel = false;
    }
  }

  // The block we branch to without checking the condition, if none of the other
  // conditions held.
  Block* DefaultTarget = nullptr;

  // Find the default target, the one without a condition
  for (auto& [Target, Details] : ProcessedBranchesOut) {
    if ((!SwitchCondition && !Details->Condition) ||
        (SwitchCondition && !Details->SwitchValues)) {
      assert(!DefaultTarget &&
             "block has branches without a default (nullptr for the "
             "condition)"); // Must be exactly one default // nullptr
      DefaultTarget = Target;
    }
  }
  // Since each Block* must* branch somewhere, this must be set
  assert(DefaultTarget);

  // root of the main part, that we are about to emit
  wasm::Expression* Root = nullptr;

  if (!SwitchCondition) {
    // We'll emit a chain of if-elses
    wasm::If* CurrIf = nullptr;

    // we build an if, then add a child, then add a child to that, etc., so we
    // must finalize them in reverse order
    std::vector<wasm::If*> finalizeStack;

    wasm::Expression* RemainingConditions = nullptr;

    for (auto iter = ProcessedBranchesOut.begin();; iter++) {
      Block* Target;
      Branch* Details;
      if (iter != ProcessedBranchesOut.end()) {
        Target = iter->first;
        if (Target == DefaultTarget) {
          continue; // done at the end
        }
        Details = iter->second;
        // must have a condition if this is not the default target
        assert(Details->Condition);
      } else {
        Target = DefaultTarget;
        Details = ProcessedBranchesOut[DefaultTarget];
      }
      bool SetCurrLabel = SetLabel && Target->IsCheckedMultipleEntry;
      bool HasFusedContent = Fused && contains(Fused->InnerMap, Target->Id);
      if (HasFusedContent) {
        assert(Details->Type == Branch::Break);
        Details->Type = Branch::Direct;
      }
      wasm::Expression* CurrContent = nullptr;
      bool IsDefault = iter == ProcessedBranchesOut.end();
      if (SetCurrLabel || Details->Type != Branch::Direct || HasFusedContent ||
          Details->Code) {
        CurrContent = Details->Render(Builder, Target, SetCurrLabel);
        if (HasFusedContent) {
          CurrContent = Builder.blockify(
            CurrContent,
            Fused->InnerMap.find(Target->Id)->second->Render(Builder, InLoop));
        }
      }
      // If there is nothing to show in this branch, omit the condition
      if (CurrContent) {
        if (IsDefault) {
          wasm::Expression* Now;
          if (RemainingConditions) {
            Now = Builder.makeIf(RemainingConditions, CurrContent);
            finalizeStack.push_back(Now->cast<wasm::If>());
          } else {
            Now = CurrContent;
          }
          if (!CurrIf) {
            assert(!Root);
            Root = Now;
          } else {
            CurrIf->ifFalse = Now;
            CurrIf->finalize();
          }
        } else {
          auto* Now = Builder.makeIf(Details->Condition, CurrContent);
          finalizeStack.push_back(Now);
          if (!CurrIf) {
            assert(!Root);
            Root = CurrIf = Now;
          } else {
            CurrIf->ifFalse = Now;
            CurrIf->finalize();
            CurrIf = Now;
          }
        }
      } else {
        auto* Now = Builder.makeUnary(wasm::EqZInt32, Details->Condition);
        if (RemainingConditions) {
          RemainingConditions =
            Builder.makeBinary(wasm::AndInt32, RemainingConditions, Now);
        } else {
          RemainingConditions = Now;
        }
      }
      if (IsDefault) {
        break;
      }
    }

    // finalize the if-chains
    while (finalizeStack.size() > 0) {
      wasm::If* curr = finalizeStack.back();
      finalizeStack.pop_back();
      curr->finalize();
    }

  } else {
    // Emit a switch
    auto Base = std::string("switch$") + std::to_string(Id);
    auto SwitchDefault = wasm::Name(Base + "$default");
    auto SwitchLeave = wasm::Name(Base + "$leave");
    std::map<Block*, wasm::Name> BlockNameMap;
    auto* Outer = Builder.makeBlock();
    auto* Inner = Outer;
    std::vector<wasm::Name> Table;
    for (auto& [Target, Details] : ProcessedBranchesOut) {
      wasm::Name CurrName;
      if (Details->SwitchValues) {
        CurrName = wasm::Name(Base + "$case$" + std::to_string(Target->Id));
      } else {
        CurrName = SwitchDefault;
      }
      // generate the content for this block
      bool SetCurrLabel = SetLabel && Target->IsCheckedMultipleEntry;
      bool HasFusedContent = Fused && contains(Fused->InnerMap, Target->Id);
      if (HasFusedContent) {
        assert(Details->Type == Branch::Break);
        Details->Type = Branch::Direct;
      }
      wasm::Expression* CurrContent = nullptr;
      if (SetCurrLabel || Details->Type != Branch::Direct || HasFusedContent ||
          Details->Code) {
        CurrContent = Details->Render(Builder, Target, SetCurrLabel);
        if (HasFusedContent) {
          CurrContent = Builder.blockify(
            CurrContent,
            Fused->InnerMap.find(Target->Id)->second->Render(Builder, InLoop));
        }
      }
      // generate a block to branch to, if we have content
      if (CurrContent) {
        auto* NextOuter = Builder.makeBlock();
        NextOuter->list.push_back(Outer);
        // breaking on Outer leads to the content in NextOuter
        Outer->name = CurrName;
        NextOuter->list.push_back(CurrContent);
        // if this is not a dead end, also need to break to the outside this is
        // both an optimization, and avoids incorrectness as adding a break in
        // unreachable code can make a place look reachable that isn't
        if (CurrContent->type != wasm::Type::unreachable) {
          NextOuter->list.push_back(Builder.makeBreak(SwitchLeave));
        }
        // prepare for more nesting
        Outer = NextOuter;
      } else {
        CurrName = SwitchLeave; // just go out straight from the table
        if (!Details->SwitchValues) {
          // this is the default, and it has no content. So make the default be
          // the leave
          for (auto& Value : Table) {
            if (Value == SwitchDefault) {
              Value = SwitchLeave;
            }
          }
          SwitchDefault = SwitchLeave;
        }
      }
      if (Details->SwitchValues) {
        for (auto Value : *Details->SwitchValues) {
          while (Table.size() <= Value) {
            Table.push_back(SwitchDefault);
          }
          Table[Value] = CurrName;
        }
      }
    }
    // finish up the whole pattern
    Outer->name = SwitchLeave;
    Inner->list.push_back(
      Builder.makeSwitch(Table, SwitchDefault, SwitchCondition));
    Root = Outer;
  }

  if (Root) {
    Ret->list.push_back(Root);
  }
  Ret->finalize();

  return Ret;
}